

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O0

categories_collection *
pstore::command_line::details::build_categories
          (categories_collection *__return_storage_ptr__,option *self,options_container *all)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference ppoVar4;
  undefined4 extraout_var;
  mapped_type *this;
  not_null<const_pstore::command_line::option_*> local_68;
  key_type local_60 [3];
  option *local_48;
  option *op;
  const_iterator __end2;
  const_iterator __begin2;
  options_container *__range2;
  options_container *all_local;
  option *self_local;
  categories_collection *categories;
  
  std::
  map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
  ::map(__return_storage_ptr__);
  __end2 = std::__cxx11::
           list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::
           begin(all);
  op = (option *)
       std::__cxx11::
       list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::end
                 (all);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&op), bVar1) {
    ppoVar4 = std::_List_const_iterator<pstore::command_line::option_*>::operator*(&__end2);
    local_48 = *ppoVar4;
    if ((local_48 != self) && (uVar2 = (*local_48->_vptr_option[9])(), (uVar2 & 1) == 0)) {
      iVar3 = (*local_48->_vptr_option[7])();
      local_60[0] = (key_type)CONCAT44(extraout_var,iVar3);
      this = std::
             map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
             ::operator[](__return_storage_ptr__,local_60);
      gsl::not_null<const_pstore::command_line::option_*>::not_null(&local_68,local_48);
      std::
      set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>
      ::insert(this,&local_68);
    }
    std::_List_const_iterator<pstore::command_line::option_*>::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

categories_collection build_categories (option const * const self,
                                                        option::options_container const & all) {
                    categories_collection categories;
                    for (option const * const op : all) {
                        if (op != self && !op->is_positional ()) {
                            categories[op->category ()].insert (op);
                        }
                    }
                    return categories;
                }